

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeNext(BtCursor *pCur,int *pRes)

{
  MemPage *pMVar1;
  ushort uVar2;
  MemPage *pPage;
  int *pRes_local;
  BtCursor *pCur_local;
  
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  *pRes = 0;
  if (pCur->eState == '\x01') {
    pMVar1 = pCur->apPage[pCur->iPage];
    uVar2 = pCur->aiIdx[pCur->iPage] + 1;
    pCur->aiIdx[pCur->iPage] = uVar2;
    if (uVar2 < pMVar1->nCell) {
      if (pMVar1->leaf == '\0') {
        pCur_local._4_4_ = moveToLeftmost(pCur);
      }
      else {
        pCur_local._4_4_ = 0;
      }
    }
    else {
      pCur->aiIdx[pCur->iPage] = pCur->aiIdx[pCur->iPage] - 1;
      pCur_local._4_4_ = btreeNext(pCur,pRes);
    }
  }
  else {
    pCur_local._4_4_ = btreeNext(pCur,pRes);
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNext(BtCursor *pCur, int *pRes){
  MemPage *pPage;
  assert( cursorOwnsBtShared(pCur) );
  assert( pRes!=0 );
  assert( *pRes==0 || *pRes==1 );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
  *pRes = 0;
  if( pCur->eState!=CURSOR_VALID ) return btreeNext(pCur, pRes);
  pPage = pCur->apPage[pCur->iPage];
  if( (++pCur->aiIdx[pCur->iPage])>=pPage->nCell ){
    pCur->aiIdx[pCur->iPage]--;
    return btreeNext(pCur, pRes);
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}